

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
helics::make_cloning_filter(FilterTypes type,CoreApp *core,string_view delivery,string_view name)

{
  string_view delivery_00;
  string_view name_00;
  __uniq_ptr_data<helics::CloningFilter,_std::default_delete<helics::CloningFilter>,_true,_true>
  in_RDI;
  size_t in_R8;
  CoreApp *in_stack_ffffffffffffff58;
  Core *core_00;
  FilterTypes in_stack_ffffffffffffff9c;
  size_t in_stack_ffffffffffffffa0;
  element_type *in_stack_ffffffffffffffc8;
  
  core_00 = (Core *)&stack0x00000008;
  CoreApp::getCopyofCorePointer(in_stack_ffffffffffffff58);
  std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::get
            ((__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  delivery_00._M_str = (char *)core_00->_vptr_Core;
  delivery_00._M_len = in_stack_ffffffffffffffa0;
  name_00._M_str = (char *)in_stack_ffffffffffffffc8;
  name_00._M_len = in_R8;
  make_cloning_filter(in_stack_ffffffffffffff9c,core_00,delivery_00,name_00);
  std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x39e620);
  return (__uniq_ptr_data<helics::CloningFilter,_std::default_delete<helics::CloningFilter>,_true,_true>
          )(tuple<helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>)
           in_RDI.
           super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
           .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<CloningFilter> make_cloning_filter(FilterTypes type,
                                                   CoreApp& core,
                                                   std::string_view delivery,
                                                   std::string_view name)

{
    return make_cloning_filter(type, core.getCopyofCorePointer().get(), delivery, name);
}